

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_flac_uninit(ma_flac *pFlac,ma_allocation_callbacks *pAllocationCallbacks)

{
  if (pFlac != (ma_flac *)0x0) {
    ma_dr_flac_close(pFlac->dr);
    return;
  }
  return;
}

Assistant:

MA_API void ma_flac_uninit(ma_flac* pFlac, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pFlac == NULL) {
        return;
    }

    (void)pAllocationCallbacks;

    #if !defined(MA_NO_FLAC)
    {
        ma_dr_flac_close(pFlac->dr);
    }
    #else
    {
        /* flac is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
    }
    #endif

    ma_data_source_uninit(&pFlac->ds);
}